

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

void libaom_examples::print_multilayer_metadata(MultilayerMetadata *multilayer)

{
  int iVar1;
  pointer pLVar2;
  long lVar3;
  pair<libaom_examples::ColorProperties,_bool> *color_properties;
  pair<libaom_examples::ColorProperties,_bool> *color_properties_00;
  pair<libaom_examples::DepthRepresentationElement,_bool> *element;
  pair<libaom_examples::DepthRepresentationElement,_bool> *element_00;
  pair<libaom_examples::DepthRepresentationElement,_bool> *element_01;
  pair<libaom_examples::DepthRepresentationElement,_bool> *element_02;
  size_t i;
  ulong uVar4;
  long lVar5;
  string local_50;
  
  puts("=== Multilayer metadata ===");
  printf("use_case: %d\n",(ulong)multilayer->use_case);
  lVar5 = 0x30;
  uVar4 = 0;
  while( true ) {
    pLVar2 = (multilayer->layers).
             super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(multilayer->layers).
                  super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2;
    if ((ulong)(lVar3 / 100) <= uVar4) break;
    printf("layer %zu\n",uVar4,lVar3 % 100);
    printf("  layer_type: %d\n",(ulong)*(uint *)((long)pLVar2 + lVar5 + -0x30));
    printf("  luma_plane_only_flag: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0x2c));
    printf("  layer_view_type: %d\n",(ulong)*(uint *)((long)pLVar2 + lVar5 + -0x28));
    printf("  group_id: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0x24));
    printf("  layer_dependency_idc: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0x23));
    printf("  layer_metadata_scope: %d\n",(ulong)*(uint *)((long)pLVar2 + lVar5 + -0x20));
    (anonymous_namespace)::format_color_properties_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)((long)pLVar2 + lVar5 + -0x1c),color_properties);
    printf("  layer_color_description: %s\n",local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = *(int *)((long)pLVar2 + lVar5 + -0x30);
    if (iVar1 == 6) {
      puts("  depth:");
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)((long)&pLVar2->layer_type + lVar5),element);
      printf("    z_near: %s\n",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)(&pLVar2->group_id + lVar5),element_00);
      printf("    z_far: %s\n",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                (&local_50,
                 (_anonymous_namespace_ *)(&(pLVar2->layer_color_description).second + lVar5),
                 element_01);
      printf("    d_min: %s\n",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                (&local_50,
                 (_anonymous_namespace_ *)
                 ((long)&(pLVar2->global_alpha_info).alpha_transparent_value + lVar5),element_02);
      printf("    d_max: %s\n",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      printf("    depth_representation_type: %d\n",
             (ulong)*(byte *)((long)&(pLVar2->global_depth_info).z_near.first + lVar5));
      printf("    disparity_ref_view_id: %d\n",
             (ulong)*(byte *)((long)&(pLVar2->global_depth_info).z_near.first + lVar5 + 1));
      putchar(10);
    }
    else if (iVar1 == 5) {
      puts("  alpha:");
      printf("    alpha_use_idc: %d\n",(ulong)*(uint *)((long)pLVar2 + lVar5 + -0x14));
      printf("    alpha_simple_flag: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0x10));
      if (*(char *)((long)pLVar2 + lVar5 + -0x10) == '\0') {
        printf("    alpha_bit_depth: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0xf));
        printf("    alpha_clip_idc: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0xe));
        printf("    alpha_incr_flag: %d\n",(ulong)*(byte *)((long)pLVar2 + lVar5 + -0xd));
        printf("    alpha_transparent_value: %hu\n",(ulong)*(ushort *)((long)pLVar2 + lVar5 + -0xc))
        ;
        printf("    alpha_opaque_value: %hu\n",(ulong)*(ushort *)((long)pLVar2 + lVar5 + -10));
        (anonymous_namespace)::format_color_properties_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)((long)pLVar2 + lVar5 + -8),
                   color_properties_00);
        printf("    alpha_color_description: %s\n",local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 100;
  }
  putchar(10);
  return;
}

Assistant:

void print_multilayer_metadata(const MultilayerMetadata &multilayer) {
  printf("=== Multilayer metadata ===\n");
  printf("use_case: %d\n", multilayer.use_case);
  for (size_t i = 0; i < multilayer.layers.size(); ++i) {
    const LayerMetadata &layer = multilayer.layers[i];
    printf("layer %zu\n", i);
    printf("  layer_type: %d\n", layer.layer_type);
    printf("  luma_plane_only_flag: %d\n", layer.luma_plane_only_flag);
    printf("  layer_view_type: %d\n", layer.layer_view_type);
    printf("  group_id: %d\n", layer.group_id);
    printf("  layer_dependency_idc: %d\n", layer.layer_dependency_idc);
    printf("  layer_metadata_scope: %d\n", layer.layer_metadata_scope);
    printf("  layer_color_description: %s\n",
           format_color_properties(layer.layer_color_description).c_str());
    if (layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA) {
      printf("  alpha:\n");
      printf("    alpha_use_idc: %d\n", layer.global_alpha_info.alpha_use_idc);
      printf("    alpha_simple_flag: %d\n",
             layer.global_alpha_info.alpha_simple_flag);
      if (!layer.global_alpha_info.alpha_simple_flag) {
        printf("    alpha_bit_depth: %d\n",
               layer.global_alpha_info.alpha_bit_depth);
        printf("    alpha_clip_idc: %d\n",
               layer.global_alpha_info.alpha_clip_idc);
        printf("    alpha_incr_flag: %d\n",
               layer.global_alpha_info.alpha_incr_flag);
        printf("    alpha_transparent_value: %hu\n",
               layer.global_alpha_info.alpha_transparent_value);
        printf("    alpha_opaque_value: %hu\n",
               layer.global_alpha_info.alpha_opaque_value);
        printf("    alpha_color_description: %s\n",
               format_color_properties(
                   layer.global_alpha_info.alpha_color_description)
                   .c_str());
      }
    } else if (layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH) {
      printf("  depth:\n");
      printf("    z_near: %s\n",
             format_depth_representation_element(layer.global_depth_info.z_near)
                 .c_str());
      printf("    z_far: %s\n",
             format_depth_representation_element(layer.global_depth_info.z_far)
                 .c_str());
      printf("    d_min: %s\n",
             format_depth_representation_element(layer.global_depth_info.d_min)
                 .c_str());
      printf("    d_max: %s\n",
             format_depth_representation_element(layer.global_depth_info.d_max)
                 .c_str());
      printf("    depth_representation_type: %d\n",
             layer.global_depth_info.depth_representation_type);
      printf("    disparity_ref_view_id: %d\n",
             layer.global_depth_info.disparity_ref_view_id);
      printf("\n");
    }
  }
  printf("\n");
}